

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.c
# Opt level: O0

void virtual_mem_main(rx_context *rx__context,void *rx__data)

{
  w_status wVar1;
  void *end_addr_00;
  size_t sVar2;
  void *pvVar3;
  void *end_addr;
  void *begin_addr;
  w_vmem mem;
  alloc_info info;
  w_status status;
  void *rx__data_local;
  rx_context *rx__context_local;
  
  wVar1 = w_vmem_create((w_vmem *)&begin_addr,(void *)0x0,0xa00000);
  rx__int_assess_comparison
            (rx__context,(long)wVar1,0,RX__OP_EQUAL,"status","W_SUCCESS",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0xd2,RX_FATAL,(char *)0x0);
  pvVar3 = begin_addr;
  end_addr_00 = (void *)((long)begin_addr + 0xa00000);
  get_alloc_info((alloc_info *)&mem,begin_addr,end_addr_00);
  rx__assess_value(rx__context,(uint)(mem.addr == pvVar3),1,"info.addr == begin_addr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
                   ,0xd8,RX_FATAL,(char *)0x0);
  rx__uint_assess_comparison
            (rx__context,(rx__uint)info.addr,0xa00000,RX__OP_EQUAL,"info.size","0xA00000",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0xd9,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)((int)info.size != 0),0,"info.committed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0xda,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)(info.size._4_4_ != 0),0,"info.shared",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0xdb,RX_FATAL,(char *)0x0);
  pvVar3 = begin_addr;
  wVar1 = w_vmem_commit((w_vmem *)&begin_addr,begin_addr,0x200000);
  rx__int_assess_comparison
            (rx__context,(long)wVar1,0,RX__OP_EQUAL,"status","W_SUCCESS",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0xe0,RX_FATAL,(char *)0x0);
  sVar2 = w_get_commit_granularity();
  touch_pages(pvVar3,0x200000,sVar2);
  pvVar3 = begin_addr;
  get_alloc_info((alloc_info *)&mem,begin_addr,end_addr_00);
  rx__assess_value(rx__context,(uint)(mem.addr == pvVar3),1,"info.addr == begin_addr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
                   ,0xe5,RX_FATAL,(char *)0x0);
  rx__uint_assess_comparison
            (rx__context,(rx__uint)info.addr,0x200000,RX__OP_EQUAL,"info.size","0x200000",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0xe6,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)((int)info.size != 0),1,"info.committed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0xe7,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)(info.size._4_4_ != 0),0,"info.shared",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0xe8,RX_FATAL,(char *)0x0);
  pvVar3 = (void *)((long)begin_addr + 0x200000);
  get_alloc_info((alloc_info *)&mem,pvVar3,end_addr_00);
  rx__assess_value(rx__context,(uint)(mem.addr == pvVar3),1,"info.addr == begin_addr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
                   ,0xec,RX_FATAL,(char *)0x0);
  rx__uint_assess_comparison
            (rx__context,(rx__uint)info.addr,0x800000,RX__OP_EQUAL,"info.size","0x800000",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0xed,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)((int)info.size != 0),0,"info.committed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0xee,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)(info.size._4_4_ != 0),0,"info.shared",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0xef,RX_FATAL,(char *)0x0);
  pvVar3 = (void *)((long)begin_addr + 0x900000);
  wVar1 = w_vmem_commit((w_vmem *)&begin_addr,pvVar3,0x100000);
  rx__int_assess_comparison
            (rx__context,(long)wVar1,0,RX__OP_EQUAL,"status","W_SUCCESS",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0xf4,RX_FATAL,(char *)0x0);
  sVar2 = w_get_commit_granularity();
  touch_pages(pvVar3,0x100000,sVar2);
  pvVar3 = begin_addr;
  get_alloc_info((alloc_info *)&mem,begin_addr,end_addr_00);
  rx__assess_value(rx__context,(uint)(mem.addr == pvVar3),1,"info.addr == begin_addr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
                   ,0xf9,RX_FATAL,(char *)0x0);
  rx__uint_assess_comparison
            (rx__context,(rx__uint)info.addr,0x200000,RX__OP_EQUAL,"info.size","0x200000",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0xfa,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)((int)info.size != 0),1,"info.committed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0xfb,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)(info.size._4_4_ != 0),0,"info.shared",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0xfc,RX_FATAL,(char *)0x0);
  pvVar3 = (void *)((long)begin_addr + 0x200000);
  get_alloc_info((alloc_info *)&mem,pvVar3,end_addr_00);
  rx__assess_value(rx__context,(uint)(mem.addr == pvVar3),1,"info.addr == begin_addr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
                   ,0x100,RX_FATAL,(char *)0x0);
  rx__uint_assess_comparison
            (rx__context,(rx__uint)info.addr,0x700000,RX__OP_EQUAL,"info.size","0x700000",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x101,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)((int)info.size != 0),0,"info.committed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x102,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)(info.size._4_4_ != 0),0,"info.shared",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x103,RX_FATAL,(char *)0x0);
  pvVar3 = (void *)((long)begin_addr + 0x900000);
  get_alloc_info((alloc_info *)&mem,pvVar3,end_addr_00);
  rx__assess_value(rx__context,(uint)(mem.addr == pvVar3),1,"info.addr == begin_addr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
                   ,0x107,RX_FATAL,(char *)0x0);
  rx__uint_assess_comparison
            (rx__context,(rx__uint)info.addr,0x100000,RX__OP_EQUAL,"info.size","0x100000",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x108,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)((int)info.size != 0),1,"info.committed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x109,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)(info.size._4_4_ != 0),0,"info.shared",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x10a,RX_FATAL,(char *)0x0);
  wVar1 = w_vmem_uncommit((w_vmem *)&begin_addr,begin_addr,0x200000);
  rx__int_assess_comparison
            (rx__context,(long)wVar1,0,RX__OP_EQUAL,"status","W_SUCCESS",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x10f,RX_FATAL,(char *)0x0);
  pvVar3 = begin_addr;
  get_alloc_info((alloc_info *)&mem,begin_addr,end_addr_00);
  rx__assess_value(rx__context,(uint)(mem.addr == pvVar3),1,"info.addr == begin_addr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
                   ,0x113,RX_FATAL,(char *)0x0);
  rx__uint_assess_comparison
            (rx__context,(rx__uint)info.addr,0x900000,RX__OP_EQUAL,"info.size","0x900000",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x114,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)((int)info.size != 0),0,"info.committed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x115,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)(info.size._4_4_ != 0),0,"info.shared",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x116,RX_FATAL,(char *)0x0);
  pvVar3 = (void *)((long)begin_addr + 0x900000);
  get_alloc_info((alloc_info *)&mem,pvVar3,end_addr_00);
  rx__assess_value(rx__context,(uint)(mem.addr == pvVar3),1,"info.addr == begin_addr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
                   ,0x11a,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)((int)info.size != 0),1,"info.committed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x11b,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)(info.size._4_4_ != 0),0,"info.shared",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x11c,RX_FATAL,(char *)0x0);
  pvVar3 = (void *)((long)begin_addr + 0x100000);
  wVar1 = w_vmem_commit((w_vmem *)&begin_addr,pvVar3,0x700000);
  rx__int_assess_comparison
            (rx__context,(long)wVar1,0,RX__OP_EQUAL,"status","W_SUCCESS",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x121,RX_FATAL,(char *)0x0);
  sVar2 = w_get_commit_granularity();
  touch_pages(pvVar3,0x700000,sVar2);
  pvVar3 = begin_addr;
  get_alloc_info((alloc_info *)&mem,begin_addr,end_addr_00);
  rx__assess_value(rx__context,(uint)(mem.addr == pvVar3),1,"info.addr == begin_addr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
                   ,0x126,RX_FATAL,(char *)0x0);
  rx__uint_assess_comparison
            (rx__context,(rx__uint)info.addr,0x100000,RX__OP_EQUAL,"info.size","0x100000",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x127,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)((int)info.size != 0),0,"info.committed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x128,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)(info.size._4_4_ != 0),0,"info.shared",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x129,RX_FATAL,(char *)0x0);
  pvVar3 = (void *)((long)begin_addr + 0x100000);
  get_alloc_info((alloc_info *)&mem,pvVar3,end_addr_00);
  rx__assess_value(rx__context,(uint)(mem.addr == pvVar3),1,"info.addr == begin_addr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
                   ,0x12d,RX_FATAL,(char *)0x0);
  rx__uint_assess_comparison
            (rx__context,(rx__uint)info.addr,0x700000,RX__OP_EQUAL,"info.size","0x700000",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x12e,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)((int)info.size != 0),1,"info.committed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x12f,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)(info.size._4_4_ != 0),0,"info.shared",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x130,RX_FATAL,(char *)0x0);
  pvVar3 = (void *)((long)begin_addr + 0x800000);
  get_alloc_info((alloc_info *)&mem,pvVar3,end_addr_00);
  rx__assess_value(rx__context,(uint)(mem.addr == pvVar3),1,"info.addr == begin_addr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
                   ,0x134,RX_FATAL,(char *)0x0);
  rx__uint_assess_comparison
            (rx__context,(rx__uint)info.addr,0x100000,RX__OP_EQUAL,"info.size","0x100000",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x135,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)((int)info.size != 0),0,"info.committed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x136,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)(info.size._4_4_ != 0),0,"info.shared",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x137,RX_FATAL,(char *)0x0);
  get_alloc_info((alloc_info *)&mem,(void *)((long)begin_addr + 0x900000),end_addr_00);
  rx__assess_value(rx__context,(uint)(mem.addr == (void *)((long)begin_addr + 0x900000)),1,
                   "info.addr == begin_addr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
                   ,0x13b,RX_FATAL,(char *)0x0);
  rx__uint_assess_comparison
            (rx__context,(rx__uint)info.addr,0x100000,RX__OP_EQUAL,"info.size","0x100000",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x13c,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)((int)info.size != 0),1,"info.committed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x13d,RX_FATAL,(char *)0x0);
  rx__bool_assess_value
            (rx__context,(uint)(info.size._4_4_ != 0),0,"info.shared",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
             ,0x13e,RX_FATAL,(char *)0x0);
  w_vmem_destroy((w_vmem *)&begin_addr,0xa00000);
  return;
}

Assistant:

int
main(
    int argc,
    const char **argv
)
{
    return rx_main(0, NULL, argc, argv) == RX_SUCCESS ? 0 : 1;
}